

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O2

void __thiscall llbuild::buildsystem::BuildValue::BuildValue(BuildValue *this,BinaryDecoder *coder)

{
  uint8_t *puVar1;
  Kind KVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  FileInfo *pFVar5;
  long lVar6;
  uint32_t i;
  uint n;
  StringList local_30;
  
  (this->stringValues).contents = (char *)0x0;
  (this->stringValues).size = 0;
  *(undefined8 *)((long)&this->valueData + 0x40) = 0;
  *(undefined8 *)((long)&this->valueData + 0x48) = 0;
  *(undefined8 *)((long)&this->valueData + 0x30) = 0;
  *(undefined8 *)((long)&this->valueData + 0x38) = 0;
  (this->valueData).asOutputInfo.modTime.seconds = 0;
  (this->valueData).asOutputInfo.modTime.nanoseconds = 0;
  (this->valueData).asOutputInfo.mode = 0;
  (this->valueData).asOutputInfo.size = 0;
  (this->valueData).asOutputInfo.device = 0;
  (this->valueData).asOutputInfo.inode = 0;
  this->kind = Invalid;
  this->numOutputInfos = 0;
  (this->signature).value = 0;
  if (coder->pos != (coder->data).Length) {
    llbuild::basic::BinaryCodingTraits<llbuild::buildsystem::BuildValue::Kind>::decode
              (&this->kind,coder);
    KVar2 = this->kind;
    if ((KVar2 < (FilteredDirectoryContents|ExistingInput)) &&
       ((0x20060U >> (KVar2 & (FilteredDirectoryContents|Target)) & 1) != 0)) {
      uVar4 = llbuild::basic::BinaryDecoder::read64(coder);
      (this->signature).value = uVar4;
      KVar2 = this->kind;
    }
    if ((KVar2 < (FilteredDirectoryContents|ExistingInput)) &&
       ((0x20414U >> (KVar2 & (FilteredDirectoryContents|Target)) & 1) != 0)) {
      uVar3 = llbuild::basic::BinaryDecoder::read32(coder);
      this->numOutputInfos = uVar3;
      if (1 < uVar3) {
        pFVar5 = (FileInfo *)operator_new__((ulong)uVar3 * 0x50);
        lVar6 = 0;
        do {
          puVar1 = (pFVar5->checksum).bytes + lVar6 + 0x10;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          puVar1[8] = '\0';
          puVar1[9] = '\0';
          puVar1[10] = '\0';
          puVar1[0xb] = '\0';
          puVar1[0xc] = '\0';
          puVar1[0xd] = '\0';
          puVar1[0xe] = '\0';
          puVar1[0xf] = '\0';
          puVar1 = (pFVar5->checksum).bytes + lVar6;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          puVar1[8] = '\0';
          puVar1[9] = '\0';
          puVar1[10] = '\0';
          puVar1[0xb] = '\0';
          puVar1[0xc] = '\0';
          puVar1[0xd] = '\0';
          puVar1[0xe] = '\0';
          puVar1[0xf] = '\0';
          lVar6 = lVar6 + 0x50;
        } while ((ulong)uVar3 * 0x50 - lVar6 != 0);
        (this->valueData).asOutputInfos = pFVar5;
      }
      for (n = 0; n != uVar3; n = n + 1) {
        pFVar5 = getNthOutputInfo(this,n);
        llbuild::basic::BinaryCodingTraits<llbuild::basic::FileInfo>::decode(pFVar5,coder);
        uVar3 = this->numOutputInfos;
      }
      KVar2 = this->kind;
    }
    if ((KVar2 < SuccessfulCommandWithOutputSignature) &&
       ((0x10090U >> (KVar2 & (FilteredDirectoryContents|Target)) & 1) != 0)) {
      llbuild::basic::StringList::StringList(&local_30,coder);
      llbuild::basic::StringList::operator=(&this->stringValues,&local_30);
      llbuild::basic::StringList::~StringList(&local_30);
    }
    llbuild::basic::BinaryDecoder::finish(coder);
  }
  return;
}

Assistant:

inline buildsystem::BuildValue::BuildValue(basic::BinaryDecoder& coder) {
  // Handle empty decode requests.
  if (coder.isEmpty()) {
    kind = BuildValue::Kind::Invalid;
    return;
  }
  
  coder.read(kind);
  if (kindHasSignature())
    coder.read(signature);
  if (kindHasOutputInfo()) {
    coder.read(numOutputInfos);
    if (numOutputInfos > 1) {
      valueData.asOutputInfos = new FileInfo[numOutputInfos];
    }
    for (uint32_t i = 0; i != numOutputInfos; ++i) {
      coder.read(getNthOutputInfo(i));
    }
  }
  if (kindHasStringList()) {
    stringValues = basic::StringList(coder);
  }
  coder.finish();
}